

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O3

void __thiscall
World_3df::breed(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  creat_t *pcVar4;
  ulong uVar5;
  char *__function;
  element_type *peVar6;
  size_t val;
  Msg local_420;
  Msg local_3f0;
  Msg local_3c0;
  Msg local_390;
  Msg local_360;
  Msg local_330;
  Msg local_300;
  Msg local_2d0;
  Msg local_2a0;
  Msg local_270;
  Msg local_240;
  Msg local_210;
  Msg local_1e0;
  Msg local_1b0;
  Msg local_180;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  element_type *local_70;
  shared_count local_68;
  double local_60;
  double local_58;
  element_type *local_50;
  World_3df *local_48;
  long local_40;
  shared_ptr<Population> *local_38;
  
  peVar1 = (this->super_World).LOGFILE.px;
  local_180.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_180._vptr_Msg = (_func_int **)peVar1;
  local_48 = this;
  local_38 = dst;
  if (peVar1 == (element_type *)0x0) {
LAB_0011256c:
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                  "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
                 );
  }
  util::logging::Msg::Msg(&local_1b0,anon_var_dwarf_37054,L_NORM);
  (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_1b0);
  util::logging::Msg::~Msg(&local_1b0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_180.msg_txt);
  peVar6 = local_38->px;
  if (peVar6 != (element_type *)0x0) {
    val = peVar6->ELITE_SIZE;
    local_40 = val << 4;
    do {
      pcVar4 = Population::get_creatures(peVar6);
      if (((long)(pcVar4->
                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pcVar4->
                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= val) {
        peVar1 = (local_48->super_World).LOGFILE.px;
        local_180.msg_txt._M_dataplus._M_p = (pointer)(local_48->super_World).LOGFILE.pn.pi_;
        if ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
          LOCK();
          ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p)->use_count_ =
               ((sp_counted_base *)local_180.msg_txt._M_dataplus._M_p)->use_count_ + 1;
          UNLOCK();
        }
        local_180._vptr_Msg = (_func_int **)peVar1;
        if (peVar1 != (element_type *)0x0) {
          util::logging::Msg::Msg(&local_1b0,anon_var_dwarf_3703e,L_NORM);
          (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_1b0);
          util::logging::Msg::~Msg(&local_1b0);
          boost::detail::shared_count::~shared_count((shared_count *)&local_180.msg_txt);
          return;
        }
        goto LAB_0011256c;
      }
      if (local_38->px == (Population *)0x0) break;
      pcVar4 = Population::get_creatures(local_38->px);
      lVar2 = *(long *)((long)&((pcVar4->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->px + local_40);
      if (lVar2 == 0) {
LAB_0011254d:
        __function = 
        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
        ;
        goto LAB_00112562;
      }
      if (local_38->px == (Population *)0x0) break;
      local_60 = *(double *)(lVar2 + 0x30);
      pcVar4 = Population::get_creatures(local_38->px);
      lVar2 = *(long *)((long)&(pcVar4->
                               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].px + local_40);
      if (lVar2 == 0) goto LAB_0011254d;
      local_58 = *(double *)(lVar2 + 0x30);
      iVar3 = rand();
      peVar6 = local_38->px;
      if (peVar6 == (element_type *)0x0) break;
      uVar5 = (ulong)((double)iVar3 / 43826196.89795918);
      uVar5 = (long)((double)iVar3 / 43826196.89795918 - 9.223372036854776e+18) &
              (long)uVar5 >> 0x3f | uVar5;
      (*peVar6->_vptr_Population[3])(peVar6,val,val + 1,uVar5);
      local_70 = (local_48->super_World).LOGFILE.px;
      local_68.pi_ = (local_48->super_World).LOGFILE.pn.pi_;
      if (local_68.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_68.pi_)->use_count_ = (local_68.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_50 = local_70;
      if (local_70 == (element_type *)0x0) goto LAB_0011256c;
      util::logging::Msg::Msg(&local_360,"... [",L_NORM);
      util::logging::Msg::operator+(&local_1e0,&local_360,val);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"]x[","");
      util::logging::Msg::operator+(&local_390,&local_1e0,&local_150);
      util::logging::Msg::operator+(&local_210,&local_390,val + 1);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"]@","");
      util::logging::Msg::operator+(&local_3f0,&local_210,&local_130);
      util::logging::Msg::operator+(&local_240,&local_3f0,uVar5);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110," = {f1: ","");
      util::logging::Msg::operator+(&local_420,&local_240,&local_110);
      util::logging::Msg::operator+(&local_270,&local_420,local_60);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0," -> ","");
      util::logging::Msg::operator+(&local_2a0,&local_270,&local_f0);
      if (local_38->px == (Population *)0x0) break;
      pcVar4 = Population::get_creatures(local_38->px);
      lVar2 = *(long *)((long)&((pcVar4->
                                super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->px + local_40);
      if (lVar2 == 0) goto LAB_0011254d;
      util::logging::Msg::operator+(&local_2d0,&local_2a0,*(double *)(lVar2 + 0x30));
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}x{f2: ","");
      util::logging::Msg::operator+(&local_3c0,&local_2d0,&local_d0);
      util::logging::Msg::operator+(&local_300,&local_3c0,local_58);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," -> ","");
      util::logging::Msg::operator+(&local_330,&local_300,&local_b0);
      if (local_38->px == (Population *)0x0) break;
      pcVar4 = Population::get_creatures(local_38->px);
      lVar2 = *(long *)((long)&(pcVar4->
                               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].px + local_40);
      if (lVar2 == 0) goto LAB_0011254d;
      util::logging::Msg::operator+(&local_180,&local_330,*(double *)(lVar2 + 0x30));
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"}","");
      util::logging::Msg::operator+(&local_1b0,&local_180,&local_90);
      (*(local_50->super_Ostream_logger).super_Logger._vptr_Logger[3])(local_50,&local_1b0);
      util::logging::Msg::~Msg(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_180);
      util::logging::Msg::~Msg(&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_300);
      util::logging::Msg::~Msg(&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_2d0);
      util::logging::Msg::~Msg(&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_270);
      util::logging::Msg::~Msg(&local_420);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_240);
      util::logging::Msg::~Msg(&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_210);
      util::logging::Msg::~Msg(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_1e0);
      util::logging::Msg::~Msg(&local_360);
      boost::detail::shared_count::~shared_count(&local_68);
      peVar6 = local_38->px;
      local_40 = local_40 + 0x20;
      val = val + 2;
    } while (peVar6 != (element_type *)0x0);
  }
  __function = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
  ;
LAB_00112562:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

void World_3df::breed( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{

	(*get_log()) << "Krzyżowanie...";

	/*
	 * First  ELITE_SIZE is elite, so we live it alone
	 *
	 * If crits count isn't even, we leave one out
	 */
	size_t i = dst->ELITE_SIZE;
	while(i < (dst->get_creatures().size() - 1))
	{
		double m1 = dst->get_creatures()[i]->get_fitness(), m2 = dst->get_creatures()[i + 1]->get_fitness();
		size_t xpnt = frand(CHROMSIZE - 1);
		dst->breed_creatures(i, i + 1, xpnt);

		(*get_log()) << util::logging::Msg("... [") + static_cast<long long> (i) + "]x[" + static_cast<long long> (i
				+ 1) + "]@" + static_cast<long long> (xpnt) + " = {f1: " + m1 + " -> "
				+ dst->get_creatures()[i]->get_fitness() + "}x{f2: " + m2 + " -> "
				+ dst->get_creatures()[i + 1]->get_fitness() + "}";
		i += 2;
	}

	(*get_log()) << "Już";
}